

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

Statement *
slang::ast::ImmediateAssertionStatement::fromSyntax
          (Compilation *compilation,ImmediateAssertionStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  ParenthesizedExpressionSyntax *pPVar1;
  ExpressionSyntax *pEVar2;
  ActionBlockSyntax *pAVar3;
  ElseClauseSyntax *pEVar4;
  SyntaxNode *this;
  bool bVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  StatementSyntax *pSVar8;
  undefined4 extraout_var_01;
  SourceLocation SVar9;
  char *func;
  SourceRange sourceRange;
  bool isFinal;
  bool isDeferred;
  Statement *ifFalse;
  AssertionKind assertKind;
  Statement *ifTrue;
  SourceRange local_40;
  Expression *this_00;
  
  assertKind = SemanticFacts::getAssertKind((syntax->super_StatementSyntax).super_SyntaxNode.kind);
  pPVar1 = (syntax->expr).ptr;
  if (pPVar1 == (ParenthesizedExpressionSyntax *)0x0) {
    func = 
    "T slang::not_null<slang::syntax::ParenthesizedExpressionSyntax *>::get() const [T = slang::syntax::ParenthesizedExpressionSyntax *]"
    ;
  }
  else {
    pEVar2 = (pPVar1->expression).ptr;
    if (pEVar2 == (ExpressionSyntax *)0x0) {
      func = 
      "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
      ;
    }
    else {
      iVar7 = Expression::bind((int)pEVar2,(sockaddr *)context,0);
      this_00 = (Expression *)CONCAT44(extraout_var,iVar7);
      bVar5 = Expression::bad(this_00);
      if (!bVar5) {
        bVar6 = ASTContext::requireBooleanConvertible(context,this_00);
        bVar5 = bVar5 || !bVar6;
      }
      ifTrue = (Statement *)0x0;
      ifFalse = (Statement *)0x0;
      pAVar3 = (syntax->action).ptr;
      if (pAVar3 != (ActionBlockSyntax *)0x0) {
        pSVar8 = pAVar3->statement;
        if (pSVar8 != (StatementSyntax *)0x0) {
          iVar7 = Statement::bind((int)pSVar8,(sockaddr *)context,(socklen_t)stmtCtx);
          ifTrue = (Statement *)CONCAT44(extraout_var_00,iVar7);
        }
        pAVar3 = (syntax->action).ptr;
        if (pAVar3 != (ActionBlockSyntax *)0x0) {
          pEVar4 = pAVar3->elseClause;
          if (pEVar4 != (ElseClauseSyntax *)0x0) {
            this = (pEVar4->clause).ptr;
            if (this == (SyntaxNode *)0x0) {
              func = 
              "T slang::not_null<slang::syntax::SyntaxNode *>::get() const [T = slang::syntax::SyntaxNode *]"
              ;
              goto LAB_0027adc3;
            }
            pSVar8 = slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>(this);
            iVar7 = Statement::bind((int)pSVar8,(sockaddr *)context,(socklen_t)stmtCtx);
            ifFalse = (Statement *)CONCAT44(extraout_var_01,iVar7);
          }
          isFinal = false;
          isDeferred = syntax->delay != (DeferredAssertionSyntax *)0x0;
          if (isDeferred) {
            isFinal = (syntax->delay->finalKeyword).info != (Info *)0x0;
          }
          if (((assertKind & ~Assume) != CoverProperty) || (ifFalse == (Statement *)0x0)) {
LAB_0027acbb:
            if (isDeferred == true) {
              if (ifTrue != (Statement *)0x0) {
                checkDeferredAssertAction(ifTrue,context);
              }
              if (ifFalse != (Statement *)0x0) {
                checkDeferredAssertAction(ifFalse,context);
              }
            }
            local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
            SVar9 = (SourceLocation)
                    BumpAllocator::
                    emplace<slang::ast::ImmediateAssertionStatement,slang::ast::AssertionKind&,slang::ast::Expression_const&,slang::ast::Statement_const*&,slang::ast::Statement_const*&,bool&,bool&,slang::SourceRange>
                              (&compilation->super_BumpAllocator,&assertKind,this_00,&ifTrue,
                               &ifFalse,&isDeferred,&isFinal,&local_40);
            if (((bVar5 != false) || ((ifTrue != (Statement *)0x0 && (ifTrue->kind == Invalid)))) ||
               ((ifFalse != (Statement *)0x0 && (ifFalse->kind == Invalid)))) {
              local_40.startLoc = SVar9;
              SVar9 = (SourceLocation)
                      BumpAllocator::
                      emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                                (&compilation->super_BumpAllocator,(Statement **)&local_40);
            }
            return (Statement *)SVar9;
          }
          pAVar3 = (syntax->action).ptr;
          if (pAVar3 != (ActionBlockSyntax *)0x0) {
            sourceRange = slang::syntax::SyntaxNode::sourceRange
                                    (&pAVar3->elseClause->super_SyntaxNode);
            ASTContext::addDiag(context,(DiagCode)0xc0008,sourceRange);
            bVar5 = true;
            goto LAB_0027acbb;
          }
        }
      }
      func = 
      "T slang::not_null<slang::syntax::ActionBlockSyntax *>::get() const [T = slang::syntax::ActionBlockSyntax *]"
      ;
    }
  }
LAB_0027adc3:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

Statement& ImmediateAssertionStatement::fromSyntax(Compilation& compilation,
                                                   const ImmediateAssertionStatementSyntax& syntax,
                                                   const ASTContext& context,
                                                   StatementContext& stmtCtx) {
    AssertionKind assertKind = SemanticFacts::getAssertKind(syntax.kind);
    auto& cond = Expression::bind(*syntax.expr->expression, context);
    bool bad = cond.bad();

    if (!bad && !context.requireBooleanConvertible(cond))
        bad = true;

    const Statement* ifTrue = nullptr;
    const Statement* ifFalse = nullptr;
    if (syntax.action->statement)
        ifTrue = &Statement::bind(*syntax.action->statement, context, stmtCtx);

    if (syntax.action->elseClause) {
        ifFalse = &Statement::bind(syntax.action->elseClause->clause->as<StatementSyntax>(),
                                   context, stmtCtx);
    }

    bool isDeferred = syntax.delay != nullptr;
    bool isFinal = false;
    if (isDeferred)
        isFinal = syntax.delay->finalKeyword.valid();

    bool isCover = assertKind == AssertionKind::CoverProperty ||
                   assertKind == AssertionKind::CoverSequence;
    if (isCover && ifFalse) {
        context.addDiag(diag::CoverStmtNoFail, syntax.action->elseClause->sourceRange());
        bad = true;
    }

    if (isDeferred) {
        if (ifTrue)
            checkDeferredAssertAction(*ifTrue, context);
        if (ifFalse)
            checkDeferredAssertAction(*ifFalse, context);
    }

    auto result = compilation.emplace<ImmediateAssertionStatement>(assertKind, cond, ifTrue,
                                                                   ifFalse, isDeferred, isFinal,
                                                                   syntax.sourceRange());
    if (bad || (ifTrue && ifTrue->bad()) || (ifFalse && ifFalse->bad()))
        return badStmt(compilation, result);

    return *result;
}